

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

void xmlRelaxNGFreeParserCtxt(xmlRelaxNGParserCtxtPtr ctxt)

{
  xmlRelaxNGDocumentPtr pxVar1;
  xmlRelaxNGIncludePtr pxVar2;
  xmlRelaxNGDocumentPtr_conflict docu;
  xmlRelaxNGIncludePtr_conflict incl;
  xmlRelaxNGDefinePtr_conflict *ppxVar3;
  long lVar4;
  
  if (ctxt == (xmlRelaxNGParserCtxtPtr)0x0) {
    return;
  }
  if (ctxt->URL != (xmlChar *)0x0) {
    (*xmlFree)(ctxt->URL);
  }
  if (ctxt->doc != (xmlRelaxNGDocumentPtr_conflict)0x0) {
    xmlRelaxNGFreeDocument(ctxt->doc);
  }
  if (ctxt->interleaves != (xmlHashTablePtr)0x0) {
    xmlHashFree(ctxt->interleaves,(xmlHashDeallocator)0x0);
  }
  docu = ctxt->documents;
  while (docu != (xmlRelaxNGDocumentPtr_conflict)0x0) {
    pxVar1 = docu->next;
    xmlRelaxNGFreeDocument(docu);
    docu = pxVar1;
  }
  incl = ctxt->includes;
  while (incl != (xmlRelaxNGIncludePtr_conflict)0x0) {
    pxVar2 = incl->next;
    xmlRelaxNGFreeInclude(incl);
    incl = pxVar2;
  }
  if (ctxt->docTab != (xmlRelaxNGDocumentPtr_conflict *)0x0) {
    (*xmlFree)(ctxt->docTab);
  }
  if (ctxt->incTab != (xmlRelaxNGIncludePtr_conflict *)0x0) {
    (*xmlFree)(ctxt->incTab);
  }
  ppxVar3 = ctxt->defTab;
  if (ppxVar3 != (xmlRelaxNGDefinePtr_conflict *)0x0) {
    if (0 < ctxt->defNr) {
      lVar4 = 0;
      do {
        xmlRelaxNGFreeDefine(ctxt->defTab[lVar4]);
        lVar4 = lVar4 + 1;
      } while (lVar4 < ctxt->defNr);
      ppxVar3 = ctxt->defTab;
    }
    (*xmlFree)(ppxVar3);
  }
  if ((ctxt->document != (xmlDocPtr)0x0) && (ctxt->freedoc != 0)) {
    xmlFreeDoc(ctxt->document);
  }
  (*xmlFree)(ctxt);
  return;
}

Assistant:

void
xmlRelaxNGFreeParserCtxt(xmlRelaxNGParserCtxtPtr ctxt)
{
    if (ctxt == NULL)
        return;
    if (ctxt->URL != NULL)
        xmlFree(ctxt->URL);
    if (ctxt->doc != NULL)
        xmlRelaxNGFreeDocument(ctxt->doc);
    if (ctxt->interleaves != NULL)
        xmlHashFree(ctxt->interleaves, NULL);
    if (ctxt->documents != NULL)
        xmlRelaxNGFreeDocumentList(ctxt->documents);
    if (ctxt->includes != NULL)
        xmlRelaxNGFreeIncludeList(ctxt->includes);
    if (ctxt->docTab != NULL)
        xmlFree(ctxt->docTab);
    if (ctxt->incTab != NULL)
        xmlFree(ctxt->incTab);
    if (ctxt->defTab != NULL) {
        int i;

        for (i = 0; i < ctxt->defNr; i++)
            xmlRelaxNGFreeDefine(ctxt->defTab[i]);
        xmlFree(ctxt->defTab);
    }
    if ((ctxt->document != NULL) && (ctxt->freedoc))
        xmlFreeDoc(ctxt->document);
    xmlFree(ctxt);
}